

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

QAccessibleInterface * __thiscall QAccessibleTable::focusChild(QAccessibleTable *this)

{
  QAccessibleObject *pQVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  QAbstractItemView *this_00;
  QListView *this_01;
  QHeaderView *pQVar5;
  QHeaderView *pQVar6;
  QAccessibleInterface *pQVar7;
  uint uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.r = 0xaaaaaaaa;
  local_48.c = 0xaaaaaaaa;
  local_48.i._0_4_ = 0xaaaaaaaa;
  local_48.i._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  QAbstractItemView::currentIndex(&local_48,this_00);
  iVar2 = local_48.c;
  pQVar7 = (QAccessibleInterface *)0x0;
  bVar9 = -1 < (local_48.r | local_48.c);
  if ((bVar9) && (local_48.m.ptr != (QAbstractItemModel *)0x0)) {
    uVar8 = 0xffffffff;
    if (bVar9 && local_48.m.ptr != (QAbstractItemModel *)0x0) {
      if (this->m_role == List) {
        (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
        QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
        this_01 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
        uVar3 = QListView::modelColumn(this_01);
        uVar8 = 0xffffffff;
        if (iVar2 == uVar3) {
          uVar8 = local_48.r;
        }
      }
      else {
        pQVar5 = verticalHeader(this);
        pQVar6 = horizontalHeader(this);
        iVar2 = local_48.r + 1;
        iVar4 = (**(code **)(*(long *)this + 0x58))(this);
        uVar8 = (uint)(pQVar5 != (QHeaderView *)0x0) + local_48.c +
                (iVar4 + (uint)(pQVar5 != (QHeaderView *)0x0)) *
                (iVar2 - (uint)(pQVar6 == (QHeaderView *)0x0));
      }
    }
    pQVar7 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x100))(this,uVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar7;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::focusChild() const
{
    QModelIndex index = view()->currentIndex();
    if (!index.isValid())
        return nullptr;

    return child(logicalIndex(index));
}